

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O2

int Am_Gesture_Set_Old_Owner_To_Me_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object cmd;
  int local_84;
  Am_Object local_80;
  Am_Object item;
  Am_Value item_value;
  Am_Value_List local_60;
  Am_Value_List items;
  Am_Object local_40;
  Am_Object local_38;
  
  cmd.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&items);
  pAVar2 = Am_Object::Get(self,0xc5,0);
  Am_Object::operator=(&cmd,pAVar2);
  bVar1 = Am_Object::Valid(&cmd);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(self);
    Am_Object::Set(&cmd,0x170,pAVar3,1);
  }
  pAVar2 = Am_Object::Get(self,0xa2,0);
  Am_Value_List::operator=(&items,pAVar2);
  Am_Value_List::Am_Value_List(&local_60,&items);
  Am_Object::Am_Object(&local_80,self);
  item_value.type = 0;
  item_value.value.wrapper_value = (Am_Wrapper *)0x0;
  item.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_60);
  local_84 = 0;
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_60);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_60);
    Am_Value::operator=(&item_value,pAVar2);
    if (item_value.type == 0xa001) {
      Am_Object::Am_Object(&local_38,&item_value);
      Am_Object::operator=(&item,&local_38);
      Am_Object::~Am_Object(&local_38);
      Am_Object::Am_Object(&local_40,&Am_Command);
      bVar1 = Am_Object::Is_Instance_Of(&item,&local_40);
      Am_Object::~Am_Object(&local_40);
      if (bVar1) {
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
        Am_Object::Set(&item,0x170,pAVar3,1);
        local_84 = 2;
      }
    }
    Am_Value_List::Next(&local_60);
  }
  Am_Object::~Am_Object(&item);
  Am_Value::~Am_Value(&item_value);
  Am_Object::~Am_Object(&local_80);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Value_List::~Am_Value_List(&items);
  Am_Object::~Am_Object(&cmd);
  return local_84;
}

Assistant:

Am_Define_Formula(int, Am_Gesture_Set_Old_Owner_To_Me)
{
  int ret = 0;
  Am_Object cmd;
  Am_Value_List items;
  cmd = self.Get(Am_COMMAND);
  if (cmd.Valid()) {
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
    ret = 1;
  }
  items = self.Get(Am_ITEMS);
  ret = set_items_list_old_owner(items, self);

  //ret not used, different values just for debugging
  return ret;
}